

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O0

void arm_cpu_do_transaction_failed_aarch64
               (CPUState *cs,hwaddr physaddr,vaddr addr,uint size,MMUAccessType access_type,
               int mmu_idx,MemTxAttrs attrs,MemTxResult response,uintptr_t retaddr)

{
  undefined1 local_60 [8];
  ARMMMUFaultInfo_conflict1 fi;
  ARMCPU_conflict1 *cpu;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  uint size_local;
  vaddr addr_local;
  hwaddr physaddr_local;
  CPUState *cs_local;
  MemTxAttrs attrs_local;
  
  fi._24_8_ = cs;
  memset(local_60,0,0x20);
  cpu_restore_state_aarch64(cs,retaddr,true);
  fi.level._2_1_ = arm_extabort_type(response);
  local_60._0_4_ = ARMFault_SyncExternal;
  arm_deliver_fault((ARMCPU_conflict1 *)fi._24_8_,addr,access_type,mmu_idx,
                    (ARMMMUFaultInfo_conflict1 *)local_60);
}

Assistant:

void arm_cpu_do_transaction_failed(CPUState *cs, hwaddr physaddr,
                                   vaddr addr, unsigned size,
                                   MMUAccessType access_type,
                                   int mmu_idx, MemTxAttrs attrs,
                                   MemTxResult response, uintptr_t retaddr)
{
    ARMCPU *cpu = ARM_CPU(cs);
    ARMMMUFaultInfo fi = { 0 };

    /* now we have a real cpu fault */
    cpu_restore_state(cs, retaddr, true);

    fi.ea = arm_extabort_type(response);
    fi.type = ARMFault_SyncExternal;
    arm_deliver_fault(cpu, addr, access_type, mmu_idx, &fi);
}